

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O0

bool CMakeWriter::write_copy_resources_for_distribution_using_rsync<chibi::StringBuilder>
               (StringBuilder *sb,ChibiLibrary *app,ChibiLibrary *library,char *destination_path)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *exclude;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  StringBuilder exclude_args;
  char *destination_path_local;
  ChibiLibrary *library_local;
  ChibiLibrary *app_local;
  StringBuilder *sb_local;
  
  exclude_args._24_8_ = destination_path;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  write_custom_command_for_distribution_va<chibi::StringBuilder>
            (sb,pcVar2,pcVar3,"${CMAKE_COMMAND} -E make_directory \"%s\"",exclude_args._24_8_);
  chibi::StringBuilder::StringBuilder((StringBuilder *)&__range3);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&library->resource_excludes);
  if (!bVar1) {
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&library->resource_excludes);
    exclude = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&library->resource_excludes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&exclude), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&__end3);
      chibi::StringBuilder::Append(sb,"--exclude \'");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      chibi::StringBuilder::Append(sb,pcVar2);
      chibi::StringBuilder::Append(sb,"\' ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  write_custom_command_for_distribution_va<chibi::StringBuilder>
            (sb,pcVar2,pcVar3,"rsync -a %s \"%s/\" \"%s\"",uVar4,uVar5,exclude_args._24_8_);
  chibi::StringBuilder::~StringBuilder((StringBuilder *)&__range3);
  return true;
}

Assistant:

static bool write_copy_resources_for_distribution_using_rsync(S & sb, const ChibiLibrary & app, const ChibiLibrary & library, const char * destination_path)
	{
		// use rsync to copy resources

		// but first make sure the target directory exists

		// note : we use a conditional to check if we're building a distribution app bundle
		//        ideally CMake would have build config dependent custom commands,
		//        but since it doesn't, we prepend 'echo' to the command, depending on
		//        whether this is a distribution build or not

		write_custom_command_for_distribution_va(sb,
			app.name.c_str(),
			library.resource_path.c_str(),
			"${CMAKE_COMMAND} -E make_directory \"%s\"",
			destination_path);
		
		StringBuilder exclude_args;

		if (library.resource_excludes.empty() == false)
		{
			for (auto & exclude : library.resource_excludes)
			{
				sb.Append("--exclude '");
				sb.Append(exclude.c_str());
				sb.Append("' ");
			}
		}

		// rsync
		write_custom_command_for_distribution_va(sb,
			app.name.c_str(),
			library.resource_path.c_str(),
			"rsync -a %s \"%s/\" \"%s\"",
			exclude_args.text.c_str(),
			library.resource_path.c_str(),
			destination_path);
		
		return true;
	}